

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O1

void predict_or_learn<true,true,false,false>(oaa *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  int iVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  v_array<char> vVar9;
  ulong uVar10;
  ostream *poVar11;
  uint uVar12;
  uint uVar13;
  polyprediction *ppVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t uVar17;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffe08;
  char in_stack_fffffffffffffe0f;
  uint32_t uVar18;
  uint64_t uVar19;
  uint32_t uVar20;
  undefined4 in_stack_fffffffffffffe20;
  float fVar21;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  uVar13 = (ec->l).multi.label;
  uVar10 = (ulong)uVar13;
  fVar21 = (ec->l).simple.weight;
  if ((uVar10 == 0) || ((uVar13 != 0xffffffff && (o->k < uVar10)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," is not in {1,",0xe);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar17 = o->k;
  ppVar14 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    uVar19 = uVar17;
    if (uVar17 != 0) {
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar2 = (ec->pred).scalar;
        fVar5 = *(float *)((long)&ec->pred + 4);
        uVar6 = *(undefined4 *)((long)&ec->pred + 8);
        uVar7 = *(undefined4 *)((long)&ec->pred + 0xc);
        sVar8 = (ec->pred).scalars.erase_count;
        (ppVar14->scalars).end_array = (ec->pred).scalars.end_array;
        (ppVar14->scalars).erase_count = sVar8;
        ppVar14->scalar = fVar2;
        *(float *)((long)&(ppVar14->scalars)._begin + 4) = fVar5;
        *(undefined4 *)&(ppVar14->scalars)._end = uVar6;
        *(undefined4 *)((long)&(ppVar14->scalars)._end + 4) = uVar7;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        ppVar14 = ppVar14 + 1;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uint)((int)uVar19 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar17,
               *(undefined8 *)(base + 0xe0),ppVar14,1);
  }
  uVar16 = 1;
  if (1 < o->k) {
    uVar16 = 1;
    uVar13 = 3;
    do {
      fVar2 = o->pred[uVar13 - 2].scalar;
      ppVar14 = o->pred + ((int)uVar16 - 1);
      if (ppVar14->scalar <= fVar2 && fVar2 != ppVar14->scalar) {
        uVar16 = (ulong)(uVar13 - 1);
      }
      uVar15 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar15 <= o->k);
  }
  if ((ec->passthrough != (features *)0x0) && (o->k != 0)) {
    uVar15 = 1;
    uVar13 = 2;
    do {
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,o->pred[uVar13 - 2].scalar,uVar15 ^ 0x398d9fda640553);
      }
      uVar15 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar15 <= o->k);
  }
  if (o->k != 0) {
    iVar3 = (int)uVar10;
    uVar13 = 0;
    do {
      (ec->l).simple.label = *(float *)(&DAT_002745f8 + (ulong)(iVar3 - 1U == uVar13) * 4);
      *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
      (ec->pred).scalar = o->pred[uVar13].scalar;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uVar13 * *(int *)(base + 0xe0));
      (**(code **)(base + 0x38))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(*(int *)(base + 0xe0) * uVar13);
      uVar12 = uVar13 + 2;
      uVar13 = uVar13 + 1;
    } while ((ulong)uVar12 <= o->k);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"1:",2);
  std::ostream::_M_insert<double>((double)o->pred->scalar);
  if (1 < o->k) {
    uVar13 = 3;
    do {
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,&stack0xfffffffffffffe0f,1);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      in_stack_fffffffffffffe0f = ':';
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,&stack0xfffffffffffffe0f,1);
      std::ostream::_M_insert<double>((double)o->pred[uVar13 - 2].scalar);
      uVar15 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar15 <= o->k);
  }
  p_Var4 = o->all->print_text;
  iVar3 = o->all->raw_prediction;
  std::__cxx11::stringbuf::str();
  vVar9._begin._7_1_ = in_stack_fffffffffffffe0f;
  vVar9._begin._0_7_ = in_stack_fffffffffffffe08;
  vVar9._end = (char *)uVar16;
  vVar9.end_array = (char *)uVar10;
  vVar9.erase_count._0_4_ = in_stack_fffffffffffffe20;
  vVar9.erase_count._4_4_ = fVar21;
  (*p_Var4)(iVar3,(string)ec->tag,vVar9);
  uVar20 = (uint32_t)uVar10;
  uVar18 = (uint32_t)uVar16;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  (ec->pred).multiclass = uVar18;
  (ec->l).multi.label = uVar20;
  (ec->l).simple.weight = fVar21;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}